

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

DynamicTypeHandler * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
ConvertToTypeWithItemAttributes
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  bool bVar1;
  ES5ArrayTypeHandlerBase<int> *pEVar2;
  DictionaryTypeHandlerBase<int> *pDVar3;
  
  bVar1 = JavascriptArray::IsNonES5Array(instance);
  if (bVar1) {
    pEVar2 = ConvertToES5ArrayType(this,instance);
    return (DynamicTypeHandler *)pEVar2;
  }
  pDVar3 = ConvertToDictionaryType(this,instance);
  return &pDVar3->super_DynamicTypeHandler;
}

Assistant:

DynamicTypeHandler* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }